

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

int __thiscall httplib::Server::bind_internal(Server *this,char *host,int port,int socket_flags)

{
  uint port_00;
  char *host_00;
  uint16_t uVar1;
  uint uVar2;
  socket_t __i;
  __int_type _Var3;
  int iVar4;
  socklen_t local_dc;
  undefined1 local_d8 [4];
  socklen_t addr_len;
  sockaddr_storage addr;
  function<void_(int)> local_48;
  int local_28;
  uint local_24;
  int socket_flags_local;
  int port_local;
  char *host_local;
  Server *this_local;
  
  local_28 = socket_flags;
  local_24 = port;
  _socket_flags_local = host;
  host_local = (char *)this;
  uVar2 = (*this->_vptr_Server[2])();
  host_00 = _socket_flags_local;
  port_00 = local_24;
  iVar4 = local_28;
  if ((uVar2 & 1) == 0) {
    this_local._4_4_ = 0xffffffff;
  }
  else {
    std::function<void_(int)>::function(&local_48,&this->socket_options_);
    __i = create_server_socket(this,host_00,port_00,iVar4,&local_48);
    std::__atomic_base<int>::operator=(&(this->svr_sock_).super___atomic_base<int>,__i);
    std::function<void_(int)>::~function(&local_48);
    _Var3 = std::__atomic_base::operator_cast_to_int((__atomic_base *)&this->svr_sock_);
    if (_Var3 == -1) {
      this_local._4_4_ = 0xffffffff;
    }
    else if (local_24 == 0) {
      local_dc = 0x80;
      _Var3 = std::__atomic_base::operator_cast_to_int((__atomic_base *)&this->svr_sock_);
      iVar4 = getsockname(_Var3,(sockaddr *)local_d8,&local_dc);
      if (iVar4 == -1) {
        this_local._4_4_ = 0xffffffff;
      }
      else if (local_d8._0_2_ == 2) {
        uVar1 = ntohs(local_d8._2_2_);
        this_local._4_4_ = (uint)uVar1;
      }
      else if (local_d8._0_2_ == 10) {
        uVar1 = ntohs(local_d8._2_2_);
        this_local._4_4_ = (uint)uVar1;
      }
      else {
        this_local._4_4_ = 0xffffffff;
      }
    }
    else {
      this_local._4_4_ = local_24;
    }
  }
  return this_local._4_4_;
}

Assistant:

inline int Server::bind_internal(const char *host, int port, int socket_flags) {
  if (!is_valid()) { return -1; }

  svr_sock_ = create_server_socket(host, port, socket_flags, socket_options_);
  if (svr_sock_ == INVALID_SOCKET) { return -1; }

  if (port == 0) {
    struct sockaddr_storage addr;
    socklen_t addr_len = sizeof(addr);
    if (getsockname(svr_sock_, reinterpret_cast<struct sockaddr *>(&addr),
                    &addr_len) == -1) {
      return -1;
    }
    if (addr.ss_family == AF_INET) {
      return ntohs(reinterpret_cast<struct sockaddr_in *>(&addr)->sin_port);
    } else if (addr.ss_family == AF_INET6) {
      return ntohs(reinterpret_cast<struct sockaddr_in6 *>(&addr)->sin6_port);
    } else {
      return -1;
    }
  } else {
    return port;
  }
}